

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view externalName,SourceLocation externalLoc,
          PortReferenceSyntax *syntax)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  Scope *this_00;
  Compilation *this_01;
  ExpressionSyntax *pEVar4;
  uint uVar5;
  string_view arg;
  NonAnsiPortListBuilder *pNVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint64_t uVar10;
  Diagnostic *pDVar11;
  PortSymbol *pPVar12;
  InterfacePortSymbol *symbol;
  SourceLocation SVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_02;
  undefined1 auVar17 [16];
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  byte bVar33;
  SourceRange sourceRange;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  LookupLocation lookupLocation;
  string_view name;
  SourceLocation loc;
  bool local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  NonAnsiPortListBuilder *local_98;
  SourceLocation local_90;
  SourceLocation local_88;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_80;
  PortReferenceSyntax *local_78;
  ulong local_70;
  ulong local_68;
  SourceLocation local_60;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  local_b8._M_str = externalName._M_str;
  local_b8._M_len = externalName._M_len;
  local_60 = externalLoc;
  local_a8 = parsing::Token::valueText(&syntax->name);
  if ((externalName._M_len == 0) && (syntax->select == (ElementSelectSyntax *)0x0)) {
    local_b8._M_len = local_a8._M_len;
    local_b8._M_str = local_a8._M_str;
  }
  this_02 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
            &(this->portInfos).super_Storage.field_0x2c8;
  local_78 = syntax;
  uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_02,
                      &local_a8);
  uVar15 = uVar10 >> ((this->portInfos).field_0x2d0 & 0x3f);
  lVar16 = (uVar10 & 0xff) * 4;
  cVar18 = (&UNK_0043a38c)[lVar16];
  cVar19 = (&UNK_0043a38d)[lVar16];
  cVar20 = (&UNK_0043a38e)[lVar16];
  bVar21 = (&UNK_0043a38f)[lVar16];
  uVar14 = 0;
  cVar22 = cVar18;
  cVar23 = cVar19;
  cVar24 = cVar20;
  bVar25 = bVar21;
  cVar26 = cVar18;
  cVar27 = cVar19;
  cVar28 = cVar20;
  bVar29 = bVar21;
  cVar30 = cVar18;
  cVar31 = cVar19;
  cVar32 = cVar20;
  bVar33 = bVar21;
  do {
    lVar16 = *(long *)&(this->portInfos).field_0x2e0;
    pcVar1 = (char *)(lVar16 + uVar15 * 0x10);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    bStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    bStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    bStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    bVar8 = pcVar1[0xf];
    auVar17[0] = -(local_48 == cVar18);
    auVar17[1] = -(cStack_47 == cVar19);
    auVar17[2] = -(cStack_46 == cVar20);
    auVar17[3] = -(bStack_45 == bVar21);
    auVar17[4] = -(cStack_44 == cVar22);
    auVar17[5] = -(cStack_43 == cVar23);
    auVar17[6] = -(cStack_42 == cVar24);
    auVar17[7] = -(bStack_41 == bVar25);
    auVar17[8] = -(cStack_40 == cVar26);
    auVar17[9] = -(cStack_3f == cVar27);
    auVar17[10] = -(cStack_3e == cVar28);
    auVar17[0xb] = -(bStack_3d == bVar29);
    auVar17[0xc] = -(cStack_3c == cVar30);
    auVar17[0xd] = -(cStack_3b == cVar31);
    auVar17[0xe] = -(cStack_3a == cVar32);
    auVar17[0xf] = -(bVar8 == bVar33);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar8;
    if (uVar9 != 0) {
      lVar2 = *(long *)&(this->portInfos).field_0x2e8;
      local_98 = this;
      local_88 = externalLoc;
      local_80 = this_02;
      local_70 = uVar15;
      local_68 = uVar14;
      local_58 = cVar18;
      cStack_57 = cVar19;
      cStack_56 = cVar20;
      bStack_55 = bVar21;
      cStack_54 = cVar22;
      cStack_53 = cVar23;
      cStack_52 = cVar24;
      bStack_51 = bVar25;
      cStack_50 = cVar26;
      cStack_4f = cVar27;
      cStack_4e = cVar28;
      bStack_4d = bVar29;
      cStack_4c = cVar30;
      cStack_4b = cVar31;
      cStack_4a = cVar32;
      bStack_49 = bVar33;
      do {
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((ulong)uVar5 * 0x58 + lVar2 + uVar15 * 0x528);
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          (local_80,&local_a8,__y);
        if (bVar7) {
          *(undefined1 *)((long)&__y[5]._M_len + 4) = 1;
          local_90 = parsing::Token::location((Token *)(__y[1]._M_len + 0x18));
          pNVar6 = local_98;
          if (*(char *)((long)&__y[5]._M_len + 5) != '\x01') {
            local_b9 = false;
            pPVar12 = BumpAllocator::
                      emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                                (&local_98->comp->super_BumpAllocator,&local_b8,&local_90,&local_b9)
            ;
            (pPVar12->super_Symbol).originatingSyntax = (SyntaxNode *)local_78;
            pPVar12->externalLoc = local_88;
            pPVar12->direction = (ArgumentDirection)__y[5]._M_len;
            pPVar12->internalSymbol = (Symbol *)__y[2]._M_str;
            lVar16 = *(long *)(__y[1]._M_len + 0x60);
            if (lVar16 == 0) {
              return &pPVar12->super_Symbol;
            }
            pEVar4 = *(ExpressionSyntax **)(lVar16 + 0x28);
            SVar13 = parsing::Token::location((Token *)(lVar16 + 0x18));
            pPVar12->initializerSyntax = pEVar4;
            pPVar12->initializerLoc = SVar13;
            return &pPVar12->super_Symbol;
          }
          if (local_b8._M_len == 0) {
            local_b8._M_len = local_a8._M_len;
            local_b8._M_str = local_a8._M_str;
          }
          if (local_78->select != (ElementSelectSyntax *)0x0) {
            this_00 = local_98->scope;
            sourceRange = slang::syntax::SyntaxNode::sourceRange
                                    (&local_78->select->super_SyntaxNode);
            pDVar11 = Scope::addDiag(this_00,(DiagCode)0x450006,sourceRange);
            arg._M_str = local_b8._M_str;
            arg._M_len = local_b8._M_len;
            Diagnostic::operator<<(pDVar11,arg);
          }
          symbol = BumpAllocator::
                   emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                             (&pNVar6->comp->super_BumpAllocator,&local_b8,&local_90);
          (symbol->super_Symbol).originatingSyntax = (SyntaxNode *)__y[1]._M_len;
          symbol->interfaceDef = (DefinitionSymbol *)__y[3]._M_str;
          pcVar1 = __y[4]._M_str;
          (symbol->modport)._M_len = __y[4]._M_len;
          (symbol->modport)._M_str = pcVar1;
          if (__y[3]._M_len == 0) {
            return &symbol->super_Symbol;
          }
          this_01 = pNVar6->comp;
          lookupLocation.index = *(undefined4 *)(__y[3]._M_len + 0x30);
          lookupLocation.scope = pNVar6->scope;
          lookupLocation._12_4_ = 0;
          attributes = AttributeSymbol::fromSyntax
                                 (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                    *)&__y[1]._M_str,pNVar6->scope,lookupLocation);
          Compilation::setAttributes(this_01,&symbol->super_Symbol,attributes);
          return &symbol->super_Symbol;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      bVar8 = *(byte *)(lVar16 + uVar15 * 0x10 + 0xf);
      uVar14 = local_68;
      this = local_98;
      uVar15 = local_70;
      this_02 = local_80;
      externalLoc = local_88;
      cVar18 = local_58;
      cVar19 = cStack_57;
      cVar20 = cStack_56;
      bVar21 = bStack_55;
      cVar22 = cStack_54;
      cVar23 = cStack_53;
      cVar24 = cStack_52;
      bVar25 = bStack_51;
      cVar26 = cStack_50;
      cVar27 = cStack_4f;
      cVar28 = cStack_4e;
      bVar29 = bStack_4d;
      cVar30 = cStack_4c;
      cVar31 = cStack_4b;
      cVar32 = cStack_4a;
      bVar33 = bStack_49;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bVar8) == 0) break;
    uVar3 = *(ulong *)&(this->portInfos).field_0x2d8;
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & uVar3;
  } while (uVar14 <= uVar3);
  if (local_a8._M_len != 0) {
    pDVar11 = Scope::addDiag(this->scope,(DiagCode)0x7e0006,externalLoc);
    Diagnostic::operator<<(pDVar11,local_a8);
  }
  local_90 = (SourceLocation)((ulong)local_90 & 0xffffffffffffff00);
  pPVar12 = BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                      (&this->comp->super_BumpAllocator,&local_b8,&local_60,(bool *)&local_90);
  pPVar12->type = this->comp->errorType;
  return &pPVar12->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view externalName, SourceLocation externalLoc,
                       const PortReferenceSyntax& syntax) {
        auto name = syntax.name.valueText();
        if (externalName.empty() && !syntax.select)
            externalName = name;

        auto it = portInfos.find(name);
        if (it == portInfos.end()) {
            if (!name.empty())
                scope.addDiag(diag::MissingPortIODeclaration, externalLoc) << name;

            auto port = comp.emplace<PortSymbol>(externalName, externalLoc, /* isAnsiPort */ false);
            port->setType(comp.getErrorType());
            return *port;
        }

        auto& info = it->second;
        info.used = true;

        auto loc = info.syntax->name.location();
        if (info.isIface) {
            // Interface ports should not have empty names. We'll be ignoring the
            // select if there is one (along with issuing an error) so just set the name.
            if (externalName.empty())
                externalName = name;

            if (syntax.select) {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, syntax.select->sourceRange());
                diag << externalName;
            }

            auto port = comp.emplace<InterfacePortSymbol>(externalName, loc);
            port->setSyntax(*info.syntax);
            port->interfaceDef = info.ifaceDef;
            port->modport = info.modport;

            if (info.insertionPoint) {
                comp.setAttributes(
                    *port, AttributeSymbol::fromSyntax(
                               info.attrs, scope,
                               LookupLocation(&scope, (uint32_t)info.insertionPoint->getIndex())));
            }

            return *port;
        }

        auto port = comp.emplace<PortSymbol>(externalName, loc, /* isAnsiPort */ false);
        port->setSyntax(syntax);
        port->externalLoc = externalLoc;

        SLANG_ASSERT(info.internalSymbol);
        port->direction = info.direction;
        port->internalSymbol = info.internalSymbol;

        if (auto init = info.syntax->initializer)
            port->setInitializerSyntax(*init->expr, init->equals.location());

        return *port;
    }